

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dlmalloc.c
# Opt level: O0

void * tmalloc_large(mstate m,size_t nb)

{
  malloc_tree_chunk *pmVar1;
  uint uVar2;
  uint uVar3;
  int iVar4;
  tchunkptr pmVar5;
  tbinptr pmVar6;
  malloc_tree_chunk *pmVar7;
  ulong *puVar8;
  byte bVar9;
  bool bVar10;
  malloc_tree_chunk *local_138;
  tchunkptr F_2;
  tchunkptr *C;
  size_t K_2;
  tchunkptr T;
  uint K_1;
  uint X_1;
  bindex_t I_1;
  tbinptr *H_1;
  tchunkptr TP;
  mchunkptr F_1;
  mchunkptr B;
  bindex_t I;
  tchunkptr C1;
  tchunkptr C0;
  tbinptr *H;
  tchunkptr *CP;
  tchunkptr *RP;
  tchunkptr F;
  tchunkptr R;
  tchunkptr XP;
  mchunkptr r;
  size_t trem_1;
  uint J;
  binmap_t leastbit;
  bindex_t i;
  binmap_t leftbits;
  size_t trem;
  tchunkptr rt;
  tchunkptr rst;
  size_t sizebits;
  uint K;
  uint X;
  bindex_t idx;
  tchunkptr t;
  size_t rsize;
  tchunkptr v;
  size_t nb_local;
  mstate m_local;
  
  rsize = 0;
  t = (tchunkptr)-nb;
  uVar3 = (uint)(nb >> 8);
  if (uVar3 == 0) {
    K = 0;
  }
  else if (uVar3 < 0x10000) {
    uVar2 = 0x1f;
    if (uVar3 != 0) {
      for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
      }
    }
    iVar4 = 0x1f - (uVar2 ^ 0x1f);
    K = iVar4 * 2 + ((uint)(nb >> ((char)iVar4 + 7U & 0x3f)) & 1);
  }
  else {
    K = 0x1f;
  }
  _X = m->treebins[K];
  if (_X != (tbinptr)0x0) {
    if (K == 0x1f) {
      bVar9 = 0;
    }
    else {
      bVar9 = 0x3f - ((char)(K >> 1) + '\x06');
    }
    rst = (tchunkptr)(nb << (bVar9 & 0x3f));
    rt = (tchunkptr)0x0;
    while( true ) {
      pmVar5 = (tchunkptr)((_X->head & 0xfffffffffffffff8) - nb);
      if ((pmVar5 < t) && (rsize = (size_t)_X, t = pmVar5, pmVar5 == (tchunkptr)0x0))
      goto LAB_001081b6;
      pmVar7 = _X->child[1];
      _X = *(malloc_tree_chunk **)((long)_X + ((long)rst >> 0x3f) * -8 + 0x20);
      if ((pmVar7 != (malloc_tree_chunk *)0x0) && (pmVar7 != _X)) {
        rt = pmVar7;
      }
      if (_X == (malloc_tree_chunk *)0x0) break;
      rst = (tchunkptr)((long)rst << 1);
    }
    _X = rt;
  }
LAB_001081b6:
  if (((_X == (tbinptr)0x0) && (rsize == 0)) &&
     (uVar3 = ((1 << ((byte)K & 0x1f)) << 1 | (1 << ((byte)K & 0x1f)) * -2) & m->treemap, uVar3 != 0
     )) {
    uVar2 = 0;
    for (uVar3 = uVar3 & -uVar3; (uVar3 & 1) == 0; uVar3 = uVar3 >> 1 | 0x80000000) {
      uVar2 = uVar2 + 1;
    }
    _X = m->treebins[uVar2];
  }
  while (_X != (tbinptr)0x0) {
    pmVar5 = (tchunkptr)((_X->head & 0xfffffffffffffff8) - nb);
    if (pmVar5 < t) {
      rsize = (size_t)_X;
      t = pmVar5;
    }
    if (_X->child[0] == (malloc_tree_chunk *)0x0) {
      local_138 = _X->child[1];
    }
    else {
      local_138 = _X->child[0];
    }
    _X = local_138;
  }
  if ((rsize == 0) || ((tchunkptr)(m->dvsize - nb) <= t)) {
    return (void *)0x0;
  }
  if ((rsize < m->least_addr) || (pmVar6 = (tbinptr)(rsize + nb), pmVar6 <= rsize)) {
    abort();
  }
  pmVar7 = *(malloc_tree_chunk **)(rsize + 0x30);
  if (*(size_t *)(rsize + 0x18) == rsize) {
    CP = (tchunkptr *)(rsize + 0x28);
    F = *(tchunkptr *)(rsize + 0x28);
    if (F == (tchunkptr)0x0) {
      CP = (tchunkptr *)(rsize + 0x20);
      F = *(tchunkptr *)(rsize + 0x20);
      if (F == (tchunkptr)0x0) goto LAB_00108493;
    }
    while( true ) {
      H = F->child + 1;
      bVar10 = true;
      if (F->child[1] == (malloc_tree_chunk *)0x0) {
        H = F->child;
        bVar10 = F->child[0] != (malloc_tree_chunk *)0x0;
      }
      if (!bVar10) break;
      CP = H;
      F = *H;
    }
    if (CP < m->least_addr) {
      abort();
    }
    *CP = (tchunkptr)0x0;
  }
  else {
    pmVar1 = *(malloc_tree_chunk **)(rsize + 0x10);
    F = *(tchunkptr *)(rsize + 0x18);
    bVar10 = false;
    if (((malloc_tree_chunk *)m->least_addr <= pmVar1) &&
       (bVar10 = false, pmVar1->bk == (malloc_tree_chunk *)rsize)) {
      bVar10 = F->fd == (malloc_tree_chunk *)rsize;
    }
    if (!bVar10) {
      abort();
    }
    pmVar1->bk = F;
    F->fd = pmVar1;
  }
LAB_00108493:
  if (pmVar7 != (malloc_tree_chunk *)0x0) {
    if ((tbinptr)rsize == m->treebins[*(uint *)(rsize + 0x38)]) {
      m->treebins[*(uint *)(rsize + 0x38)] = F;
      if (F == (tchunkptr)0x0) {
        m->treemap = (1 << ((byte)*(undefined4 *)(rsize + 0x38) & 0x1f) ^ 0xffffffffU) & m->treemap;
      }
    }
    else {
      if (pmVar7 < (malloc_tree_chunk *)m->least_addr) {
        abort();
      }
      if (pmVar7->child[0] == (malloc_tree_chunk *)rsize) {
        pmVar7->child[0] = F;
      }
      else {
        pmVar7->child[1] = F;
      }
    }
    if (F != (tchunkptr)0x0) {
      if (F < (tchunkptr)m->least_addr) {
        abort();
      }
      F->parent = pmVar7;
      pmVar7 = *(malloc_tree_chunk **)(rsize + 0x20);
      if (pmVar7 != (malloc_tree_chunk *)0x0) {
        if (pmVar7 < (malloc_tree_chunk *)m->least_addr) {
          abort();
        }
        F->child[0] = pmVar7;
        pmVar7->parent = F;
      }
      pmVar7 = *(malloc_tree_chunk **)(rsize + 0x28);
      if (pmVar7 != (malloc_tree_chunk *)0x0) {
        if (pmVar7 < (malloc_tree_chunk *)m->least_addr) {
          abort();
        }
        F->child[1] = pmVar7;
        pmVar7->parent = F;
      }
    }
  }
  if (t < (tchunkptr)0x20) {
    *(size_t *)(rsize + 8) = (long)t->child + (nb - 0x20) | 3;
    *(ulong *)((long)t->child + rsize + nb + -0x18) =
         *(ulong *)((long)t->child + rsize + nb + -0x18) | 1;
  }
  else {
    *(size_t *)(rsize + 8) = nb | 3;
    pmVar6->head = (ulong)t | 1;
    *(tchunkptr *)((long)t->child + (long)(pmVar6->child + -8)) = t;
    if ((ulong)t >> 3 < 0x20) {
      pmVar7 = (malloc_tree_chunk *)(m->smallbins + (uint)((int)((ulong)t >> 3) << 1));
      bVar9 = (byte)((ulong)t >> 3);
      if ((m->smallmap & 1 << (bVar9 & 0x1f)) == 0) {
        m->smallmap = 1 << (bVar9 & 0x1f) | m->smallmap;
        TP = pmVar7;
      }
      else {
        if (pmVar7->fd < (malloc_tree_chunk *)m->least_addr) {
          abort();
        }
        TP = pmVar7->fd;
      }
      pmVar7->fd = pmVar6;
      TP->bk = pmVar6;
      pmVar6->fd = TP;
      pmVar6->bk = pmVar7;
    }
    else {
      uVar3 = (uint)((ulong)t >> 8);
      if (uVar3 == 0) {
        K_1 = 0;
      }
      else if (uVar3 < 0x10000) {
        uVar2 = 0x1f;
        if (uVar3 != 0) {
          for (; uVar3 >> uVar2 == 0; uVar2 = uVar2 - 1) {
          }
        }
        iVar4 = 0x1f - (uVar2 ^ 0x1f);
        K_1 = iVar4 * 2 + ((uint)((ulong)t >> ((char)iVar4 + 7U & 0x3f)) & 1);
      }
      else {
        K_1 = 0x1f;
      }
      pmVar7 = (malloc_tree_chunk *)(m->treebins + K_1);
      pmVar6->index = K_1;
      pmVar6->child[1] = (malloc_tree_chunk *)0x0;
      pmVar6->child[0] = (malloc_tree_chunk *)0x0;
      if ((m->treemap & 1 << ((byte)K_1 & 0x1f)) == 0) {
        m->treemap = 1 << ((byte)K_1 & 0x1f) | m->treemap;
        pmVar7->prev_foot = (size_t)pmVar6;
        pmVar6->parent = pmVar7;
        pmVar6->bk = pmVar6;
        pmVar6->fd = pmVar6;
      }
      else {
        K_2 = pmVar7->prev_foot;
        if (K_1 == 0x1f) {
          bVar9 = 0;
        }
        else {
          bVar9 = 0x3f - ((char)(K_1 >> 1) + '\x06');
        }
        C = (tchunkptr *)((long)t << (bVar9 & 0x3f));
        while ((tchunkptr)(*(ulong *)(K_2 + 8) & 0xfffffffffffffff8) != t) {
          puVar8 = (ulong *)(K_2 + 0x20 + ((long)C >> 0x3f) * -8);
          C = (tchunkptr *)((long)C << 1);
          if (*puVar8 == 0) {
            if (puVar8 < m->least_addr) {
              abort();
            }
            *puVar8 = (ulong)pmVar6;
            pmVar6->parent = (malloc_tree_chunk *)K_2;
            pmVar6->bk = pmVar6;
            pmVar6->fd = pmVar6;
            goto LAB_00108ae3;
          }
          K_2 = *puVar8;
        }
        pmVar7 = *(malloc_tree_chunk **)(K_2 + 0x10);
        bVar10 = false;
        if (m->least_addr <= K_2) {
          bVar10 = (malloc_tree_chunk *)m->least_addr <= pmVar7;
        }
        if (!bVar10) {
          abort();
        }
        pmVar7->bk = pmVar6;
        *(tbinptr *)(K_2 + 0x10) = pmVar6;
        pmVar6->fd = pmVar7;
        pmVar6->bk = (malloc_tree_chunk *)K_2;
        pmVar6->parent = (malloc_tree_chunk *)0x0;
      }
    }
  }
LAB_00108ae3:
  return (void *)(rsize + 0x10);
}

Assistant:

static void* tmalloc_large(mstate m, size_t nb) {
  tchunkptr v = 0;
  size_t rsize = -nb; /* Unsigned negation */
  tchunkptr t;
  bindex_t idx;
  compute_tree_index(nb, idx);
  if ((t = *treebin_at(m, idx)) != 0) {
    /* Traverse tree for this bin looking for node with size == nb */
    size_t sizebits = nb << leftshift_for_tree_index(idx);
    tchunkptr rst = 0;  /* The deepest untaken right subtree */
    for (;;) {
      tchunkptr rt;
      size_t trem = chunksize(t) - nb;
      if (trem < rsize) {
        v = t;
        if ((rsize = trem) == 0)
          break;
      }
      rt = t->child[1];
      t = t->child[(sizebits >> (SIZE_T_BITSIZE-SIZE_T_ONE)) & 1];
      if (rt != 0 && rt != t)
        rst = rt;
      if (t == 0) {
        t = rst; /* set t to least subtree holding sizes > nb */
        break;
      }
      sizebits <<= 1;
    }
  }
  if (t == 0 && v == 0) { /* set t to root of next non-empty treebin */
    binmap_t leftbits = left_bits(idx2bit(idx)) & m->treemap;
    if (leftbits != 0) {
      bindex_t i;
      binmap_t leastbit = least_bit(leftbits);
      compute_bit2idx(leastbit, i);
      t = *treebin_at(m, i);
    }
  }

  while (t != 0) { /* find smallest of tree or subtree */
    size_t trem = chunksize(t) - nb;
    if (trem < rsize) {
      rsize = trem;
      v = t;
    }
    t = leftmost_child(t);
  }

  /*  If dv is a better fit, return 0 so malloc will use it */
  if (v != 0 && rsize < (size_t)(m->dvsize - nb)) {
    if (RTCHECK(ok_address(m, v))) { /* split */
      mchunkptr r = chunk_plus_offset(v, nb);
      assert(chunksize(v) == rsize + nb);
      if (RTCHECK(ok_next(v, r))) {
        unlink_large_chunk(m, v);
        if (rsize < MIN_CHUNK_SIZE)
          set_inuse_and_pinuse(m, v, (rsize + nb));
        else {
          set_size_and_pinuse_of_inuse_chunk(m, v, nb);
          set_size_and_pinuse_of_free_chunk(r, rsize);
          insert_chunk(m, r, rsize);
        }
        return chunk2mem(v);
      }
    }
    CORRUPTION_ERROR_ACTION(m);
  }
  return 0;
}